

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O2

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *input;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  string *psVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  long lVar7;
  ostream *poVar8;
  cmTarget *pcVar9;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  allocator<char> local_1ed;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  input = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (input == psVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments",(allocator<char> *)&srclists
              );
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_002347cf;
  }
  local_1e4 = 0;
  bVar4 = false;
  local_1ec = 0;
  local_1e8 = 0;
  bVar3 = false;
  bVar5 = false;
  __first._M_current = input;
  while (__first._M_current = __first._M_current + 1, __first._M_current != psVar6) {
    bVar1 = std::operator==(__first._M_current,"WIN32");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = std::operator==(__first._M_current,"MACOSX_BUNDLE");
      bVar2 = bVar5;
      if (bVar1) {
        bVar3 = true;
      }
      else {
        bVar1 = std::operator==(__first._M_current,"EXCLUDE_FROM_ALL");
        if (bVar1) {
          local_1e8 = (uint)CONCAT71(extraout_var,1);
        }
        else {
          bVar1 = std::operator==(__first._M_current,"IMPORTED");
          if (bVar1) {
            local_1e4 = (uint)CONCAT71(extraout_var_00,1);
          }
          else if (((local_1e4 & 1) == 0) ||
                  (bVar1 = std::operator==(__first._M_current,"GLOBAL"), !bVar1)) {
            bVar1 = std::operator==(__first._M_current,"ALIAS");
            if (!bVar1) break;
            local_1ec = (uint)CONCAT71(extraout_var_01,1);
          }
          else {
            bVar4 = true;
          }
        }
      }
    }
    bVar5 = bVar2;
    psVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar2 = cmGeneratorExpression::IsValidTargetName(input);
  if ((!bVar2) || (bVar2 = cmGlobalGenerator::IsReservedTarget(input), bVar2)) {
LAB_0023452d:
    bVar2 = cmMakefile::CheckCMP0037((this->super_cmCommand).Makefile,input,EXECUTABLE);
    if (!bVar2) {
      return false;
    }
    if ((local_1e4 & 1) != 0) goto LAB_00234580;
LAB_002345ff:
    if ((local_1ec & 1) == 0) {
      _e = (pointer)local_198;
      local_198[0]._M_local_buf[0] = '\0';
      bVar4 = cmMakefile::EnforceUniqueName
                        ((this->super_cmCommand).Makefile,input,(string *)&e,false);
      if (bVar4) {
        std::__cxx11::string::~string((string *)&e);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&srclists,
                   __first,(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&e);
        pcVar9 = cmMakefile::AddExecutable
                           ((this->super_cmCommand).Makefile,input,&srclists,
                            (bool)((byte)local_1e8 & 1));
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"WIN32_EXECUTABLE",&local_1ed);
          cmTarget::SetProperty(pcVar9,(string *)&e,"ON");
          std::__cxx11::string::~string((string *)&e);
        }
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"MACOSX_BUNDLE",&local_1ed);
          cmTarget::SetProperty(pcVar9,(string *)&e,"ON");
          std::__cxx11::string::~string((string *)&e);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&srclists);
        return true;
      }
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_002347cf;
    }
    bVar5 = false;
  }
  else {
    if ((local_1e4 & 1) == 0) {
      if (((local_1ec & 1) == 0) &&
         (lVar7 = std::__cxx11::string::find((char)input,0x3a), lVar7 != -1)) goto LAB_0023452d;
      goto LAB_002345ff;
    }
LAB_00234580:
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"may not be given WIN32 for an IMPORTED target.",
                 (allocator<char> *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_002347cf;
    }
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                 (allocator<char> *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_002347cf;
    }
    if ((local_1e8 & 1) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",
                 (allocator<char> *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_002347cf;
    }
    bVar5 = true;
    if ((local_1ec & 1) == 0) {
      pcVar9 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,input,false);
      if (pcVar9 == (cmTarget *)0x0) {
        cmMakefile::AddImportedTarget((this->super_cmCommand).Makefile,input,EXECUTABLE,bVar4);
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar8 = std::operator<<((ostream *)&e,"cannot create imported target \"");
      poVar8 = std::operator<<(poVar8,(string *)input);
      std::operator<<(poVar8,"\" because another target with the same name already exists.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_00234952;
    }
  }
  bVar3 = cmGeneratorExpression::IsValidTargetName(input);
  if (bVar3) {
    if ((local_1e8 & 1) == 0) {
      if ((!bVar5) && (!bVar4)) {
        if ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == 0x60) {
          bVar5 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,__first._M_current);
          if (bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar8 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
            poVar8 = std::operator<<(poVar8,(string *)input);
            poVar8 = std::operator<<(poVar8,"\" because target \"");
            poVar8 = std::operator<<(poVar8,(string *)__first._M_current);
            std::operator<<(poVar8,"\" is itself an ALIAS.");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
          }
          else {
            pcVar9 = cmMakefile::FindTargetToUse
                               ((this->super_cmCommand).Makefile,__first._M_current,true);
            if (pcVar9 == (cmTarget *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar8 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
              poVar8 = std::operator<<(poVar8,(string *)input);
              poVar8 = std::operator<<(poVar8,"\" because target \"");
              poVar8 = std::operator<<(poVar8,(string *)__first._M_current);
              std::operator<<(poVar8,"\" does not already exist.");
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
            }
            else if (pcVar9->TargetTypeValue == EXECUTABLE) {
              if ((pcVar9->IsImportedTarget != true) || (pcVar9->ImportedGloballyVisible != false))
              {
                cmMakefile::AddAlias((this->super_cmCommand).Makefile,input,__first._M_current);
                return true;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar8 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
              poVar8 = std::operator<<(poVar8,(string *)input);
              poVar8 = std::operator<<(poVar8,"\" because target \"");
              poVar8 = std::operator<<(poVar8,(string *)__first._M_current);
              std::operator<<(poVar8,"\" is imported but not globally visible.");
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar8 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
              poVar8 = std::operator<<(poVar8,(string *)input);
              poVar8 = std::operator<<(poVar8,"\" because target \"");
              poVar8 = std::operator<<(poVar8,(string *)__first._M_current);
              std::operator<<(poVar8,"\" is not an executable.");
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          std::operator<<((ostream *)&e,"ALIAS requires exactly one target argument.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
        }
LAB_00234952:
        std::__cxx11::string::~string((string *)&srclists);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        return false;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"IMPORTED with ALIAS is not allowed.",(allocator<char> *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                 (allocator<char> *)&srclists);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   "Invalid name for ALIAS: ",input);
    cmCommand::SetError(&this->super_cmCommand,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
  }
LAB_002347cf:
  std::__cxx11::string::~string((string *)&e);
  return false;
}

Assistant:

bool cmAddExecutableCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk &&
      !this->Makefile->CheckCMP0037(exename, cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      this->SetError("may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    std::string const& aliasedName = *s;
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" does not already exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is not an executable.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported() &&
        !aliasedTarget->IsImportedGloballyVisible()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is imported but not globally visible.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(exename)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmStateEnums::EXECUTABLE,
                                      importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(exename, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt =
    this->Makefile->AddExecutable(exename, srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}